

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::ServiceGenerator::GenerateDeclarations
          (ServiceGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  io::Printer::Print(printer,&this->vars_,"class $classname$_Stub;\n\n");
  GenerateInterface(this,printer);
  GenerateStubDefinition(this,printer);
  return;
}

Assistant:

void ServiceGenerator::GenerateDeclarations(io::Printer* printer) {
  // Forward-declare the stub type.
  printer->Print(vars_,
    "class $classname$_Stub;\n"
    "\n");

  GenerateInterface(printer);
  GenerateStubDefinition(printer);
}